

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

uint16_t reverseLutFromBitmap(uint8_t *bitmap,uint16_t *lut)

{
  short sVar1;
  uint32_t i;
  uint32_t k;
  uint32_t n;
  uint16_t *lut_local;
  uint8_t *bitmap_local;
  
  k = 0;
  for (i = 0; i < 0x10000; i = i + 1) {
    if ((i == 0) || (((uint)bitmap[i >> 3] & 1 << ((byte)i & 7)) != 0)) {
      lut[k] = (uint16_t)i;
      k = k + 1;
    }
  }
  sVar1 = (short)k;
  while (k < 0x10000) {
    lut[k] = 0;
    k = k + 1;
  }
  return sVar1 - 1;
}

Assistant:

static inline uint16_t
reverseLutFromBitmap (const uint8_t* NO_ALIAS bitmap, uint16_t* NO_ALIAS lut)
{
    uint32_t n, k = 0;

    for (uint32_t i = 0; i < USHORT_RANGE; ++i)
    {
        if ((i == 0) || (bitmap[i >> 3] & (1 << (i & 7))))
            lut[k++] = (uint16_t) i;
    }

    n = k - 1;

    while (k < USHORT_RANGE)
        lut[k++] = 0;

    return (uint16_t) n;
}